

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::MaybeIgnoreError(DBImpl *this,Status *s)

{
  long lVar1;
  Logger *info_log;
  bool bVar2;
  char *pcVar3;
  long in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  Status *in_stack_ffffffffffffff90;
  Status *this_00;
  Status local_28 [2];
  Status *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Status::ok((Status *)in_stack_ffffffffffffff88);
  if ((!bVar2) && ((*(byte *)(in_RDI + 0x3a) & 1) == 0)) {
    info_log = *(Logger **)(in_RDI + 0x48);
    this_00 = local_28;
    Status::ToString_abi_cxx11_(in_stack_ffffffffffffffe8);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_ffffffffffffff88);
    Log(info_log,"Ignoring error %s",pcVar3);
    std::__cxx11::string::~string(in_stack_ffffffffffffff88);
    Status::OK();
    Status::operator=(this_00,in_stack_ffffffffffffff90);
    Status::~Status((Status *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::MaybeIgnoreError(Status* s) const {
  if (s->ok() || options_.paranoid_checks) {
    // No change needed
  } else {
    Log(options_.info_log, "Ignoring error %s", s->ToString().c_str());
    *s = Status::OK();
  }
}